

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O3

void __thiscall
cubeb_resampler_drift_drop_data_Test::TestBody(cubeb_resampler_drift_drop_data_Test *this)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  float *pfVar4;
  float *pfVar5;
  ulong uVar6;
  int j;
  long lVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  AssertHelper AVar11;
  char *pcVar12;
  uint uVar13;
  byte bVar14;
  int iVar15;
  int iVar17;
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  long normal_input_frame_count;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_110;
  long frames;
  float *local_100;
  long local_f8;
  cubeb_resampler *local_f0;
  long got;
  AssertHelper local_e0;
  long BUF_BASE_SIZE;
  uint local_d0;
  closure c;
  long prebuffer_frames;
  vector<float,_std::allocator<float>_> input_buffer_normal;
  vector<float,_std::allocator<float>_> input_buffer_prebuffer;
  cubeb_stream_params input_params;
  vector<float,_std::allocator<float>_> input_buffer_glitch;
  cubeb_stream_params output_params;
  AssertHelper local_38;
  
  lVar8 = 1;
  lVar9 = 4;
  do {
    c.input_channel_count = (int)lVar8;
    input_params.format = CUBEB_SAMPLE_FLOAT32LE;
    input_params.rate = 0xac44;
    output_params.channels = 2;
    output_params.format = CUBEB_SAMPLE_FLOAT32LE;
    output_params.rate = 0xac44;
    input_params.channels = c.input_channel_count;
    local_f0 = cubeb_resampler_create
                         ((cubeb_stream *)0x0,&input_params,&output_params,0xac44,
                          cb_passthrough_resampler_duplex,&c,CUBEB_RESAMPLER_QUALITY_VOIP,
                          CUBEB_RESAMPLER_RECLOCK_NONE);
    BUF_BASE_SIZE = 0x100;
    std::vector<float,_std::allocator<float>_>::vector
              (&input_buffer_prebuffer,lVar8 * 0x200,(allocator_type *)&input_buffer_glitch);
    std::vector<float,_std::allocator<float>_>::vector
              (&input_buffer_glitch,lVar8 * 0xa00,(allocator_type *)&input_buffer_normal);
    std::vector<float,_std::allocator<float>_>::vector
              (&input_buffer_normal,lVar8 << 8,(allocator_type *)&normal_input_frame_count);
    local_100 = (float *)operator_new(0x800);
    memset(local_100,0,0x800);
    uVar2 = (ulong)((long)input_buffer_prebuffer.super__Vector_base<float,_std::allocator<float>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)input_buffer_prebuffer.super__Vector_base<float,_std::allocator<float>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 2) /
            (ulong)input_params.channels;
    if (0 < (long)uVar2) {
      lVar3 = 0;
      uVar6 = 0;
      do {
        lVar7 = 0;
        do {
          input_buffer_prebuffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[(uint)((int)lVar3 + (int)lVar7)] = (float)(long)uVar6;
          lVar7 = lVar7 + 1;
        } while (lVar8 != lVar7);
        uVar6 = uVar6 + 1;
        lVar3 = lVar3 + lVar8;
      } while (uVar6 != uVar2);
    }
    prebuffer_frames = uVar2;
    got = cubeb_resampler_fill
                    (local_f0,input_buffer_prebuffer.
                              super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start,&prebuffer_frames,local_100,0x100);
    testing::internal::CmpHelperEQ<long,long>
              ((internal *)&normal_input_frame_count,"prebuffer_frames","BUF_BASE_SIZE",
               &prebuffer_frames,&BUF_BASE_SIZE);
    if ((char)normal_input_frame_count == '\0') {
      testing::Message::Message((Message *)&frames);
      pcVar12 = "";
      if (local_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar12 = (local_110->_M_dataplus)._M_p;
      }
      iVar15 = 0x39e;
LAB_0010d3cd:
      testing::internal::AssertHelper::AssertHelper
                (&local_e0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/mozilla[P]cubeb/test/test_resampler.cpp"
                 ,iVar15,pcVar12);
      testing::internal::AssertHelper::operator=(&local_e0,(Message *)&frames);
      testing::internal::AssertHelper::~AssertHelper(&local_e0);
      AVar11.data_ = (AssertHelperData *)frames;
      if (frames != 0) {
LAB_0010d3f1:
        (**(code **)(*(long *)AVar11.data_ + 8))();
      }
LAB_0010d3f7:
      if (local_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_110,local_110);
      }
      bVar14 = 1;
    }
    else {
      if (local_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_110,local_110);
      }
      testing::internal::CmpHelperEQ<long,long>
                ((internal *)&normal_input_frame_count,"got","BUF_BASE_SIZE",&got,&BUF_BASE_SIZE);
      if ((char)normal_input_frame_count == '\0') {
        testing::Message::Message((Message *)&frames);
        pcVar12 = "";
        if (local_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar12 = (local_110->_M_dataplus)._M_p;
        }
        iVar15 = 0x39f;
        goto LAB_0010d3cd;
      }
      if (local_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_110,local_110);
      }
      lVar3 = lVar8 + -1;
      auVar16._8_4_ = (int)lVar3;
      auVar16._0_8_ = lVar3;
      auVar16._12_4_ = (int)((ulong)lVar3 >> 0x20);
      auVar16 = auVar16 ^ _DAT_0014e100;
      iVar15 = auVar16._0_4_;
      auVar18._0_4_ = -(uint)(iVar15 == -0x80000000);
      auVar18._4_4_ = -(uint)(auVar16._4_4_ == -0x80000000);
      iVar17 = auVar16._8_4_;
      auVar18._8_4_ = -(uint)(iVar17 == -0x7fffffff);
      auVar18._12_4_ = -(uint)(auVar16._12_4_ == -0x80000000);
      auVar19._0_4_ = -(uint)(iVar15 < -0x80000000);
      auVar19._4_4_ = -(uint)(iVar15 < -0x80000000);
      auVar19._8_4_ = -(uint)(iVar17 < -0x7fffffff);
      auVar19._12_4_ = -(uint)(iVar17 < -0x7fffffff);
      uVar13 = movmskpd(2,auVar19 & auVar18);
      uVar13 = uVar13 ^ 3;
      bVar14 = (byte)uVar13;
      local_f8 = 0x100;
      uVar10 = 0;
      do {
        pfVar5 = local_100;
        frames = 0x100;
        uVar1 = uVar10 + ((uVar10 & 0xffff) / 100) * -100;
        local_d0 = uVar10;
        if ((short)uVar1 == 2) {
          pfVar5 = input_buffer_normal.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start + 1;
          lVar3 = 0;
          do {
            if ((uVar13 & 1) != 0) {
              pfVar5[-1] = (float)(long)(uVar2 + lVar3);
            }
            if (bVar14 >> 1 != 0) {
              *pfVar5 = (float)(long)(uVar2 + lVar3);
            }
            lVar3 = lVar3 + 1;
            pfVar5 = (float *)((long)pfVar5 + lVar9);
          } while (lVar3 != 0x100);
          uVar2 = uVar2 + 0x100;
          normal_input_frame_count = 0x100;
          got = cubeb_resampler_fill
                          (local_f0,input_buffer_normal.
                                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._M_start,&normal_input_frame_count,
                           local_100,0x100);
          is_not_seq<float>(local_100,2,0x100,local_f8);
          local_f8 = (long)(local_100[0x1ff] + 1.0);
        }
        else {
          if ((uVar1 & 0xffff) == 1) {
            pfVar4 = input_buffer_glitch.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start + 1;
            lVar3 = 0;
            do {
              if ((uVar13 & 1) != 0) {
                pfVar4[-1] = (float)(long)(uVar2 + lVar3);
              }
              if (bVar14 >> 1 != 0) {
                *pfVar4 = (float)(long)(uVar2 + lVar3);
              }
              lVar3 = lVar3 + 1;
              pfVar4 = (float *)((long)pfVar4 + lVar9);
            } while (lVar3 != 0xa00);
            uVar2 = uVar2 + 0xa00;
            frames = 0xa00;
            got = cubeb_resampler_fill
                            (local_f0,input_buffer_glitch.
                                      super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                      super__Vector_impl_data._M_start,&frames,local_100,0x100);
            lVar3 = local_f8;
            is_seq<float>(pfVar5,2,0x100,local_f8);
          }
          else {
            pfVar4 = input_buffer_normal.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start + 1;
            lVar3 = 0;
            do {
              if ((uVar13 & 1) != 0) {
                pfVar4[-1] = (float)(long)(uVar2 + lVar3);
              }
              if (bVar14 >> 1 != 0) {
                *pfVar4 = (float)(long)(uVar2 + lVar3);
              }
              lVar3 = lVar3 + 1;
              pfVar4 = (float *)((long)pfVar4 + lVar9);
            } while (lVar3 != 0x100);
            uVar2 = uVar2 + 0x100;
            normal_input_frame_count = 0x100;
            got = cubeb_resampler_fill
                            (local_f0,input_buffer_normal.
                                      super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                      super__Vector_impl_data._M_start,&normal_input_frame_count,
                             local_100,0x100);
            lVar3 = local_f8;
            is_seq<float>(pfVar5,2,0x100,local_f8);
          }
          local_f8 = lVar3 + 0x100;
        }
        testing::internal::CmpHelperEQ<long,long>
                  ((internal *)&normal_input_frame_count,"got","BUF_BASE_SIZE",&got,&BUF_BASE_SIZE);
        if ((char)normal_input_frame_count == '\0') {
          testing::Message::Message((Message *)&local_e0);
          pcVar12 = "";
          if (local_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar12 = (local_110->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_38,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/mozilla[P]cubeb/test/test_resampler.cpp"
                     ,0x3c9,pcVar12);
          testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_e0);
          testing::internal::AssertHelper::~AssertHelper(&local_38);
          AVar11.data_ = local_e0.data_;
          if (local_e0.data_ == (AssertHelperData *)0x0) goto LAB_0010d3f7;
          goto LAB_0010d3f1;
        }
        if (local_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_110,local_110);
        }
        uVar10 = local_d0 + 1;
      } while (uVar10 != 300);
      cubeb_resampler_destroy(local_f0);
      bVar14 = 0;
    }
    operator_delete(local_100,0x800);
    if (input_buffer_normal.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(input_buffer_normal.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)input_buffer_normal.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)input_buffer_normal.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (input_buffer_glitch.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(input_buffer_glitch.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)input_buffer_glitch.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)input_buffer_glitch.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (input_buffer_prebuffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(input_buffer_prebuffer.super__Vector_base<float,_std::allocator<float>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)input_buffer_prebuffer.super__Vector_base<float,_std::allocator<float>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)input_buffer_prebuffer.super__Vector_base<float,_std::allocator<float>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    lVar8 = lVar8 + 1;
    lVar9 = lVar9 + 4;
    if ((bool)(bVar14 | lVar8 == 3)) {
      return;
    }
  } while( true );
}

Assistant:

TEST(cubeb, resampler_drift_drop_data)
{
  for (uint32_t input_channels = 1; input_channels < 3; input_channels++) {
    cubeb_stream_params input_params;
    cubeb_stream_params output_params;

    const int output_channels = 2;
    const int sample_rate = 44100;

    input_params.channels = input_channels;
    input_params.rate = sample_rate;
    input_params.format = CUBEB_SAMPLE_FLOAT32NE;

    output_params.channels = output_channels;
    output_params.rate = sample_rate;
    output_params.format = CUBEB_SAMPLE_FLOAT32NE;

    int target_rate = input_params.rate;

    closure c;
    c.input_channel_count = input_channels;

    cubeb_resampler * resampler = cubeb_resampler_create(
        (cubeb_stream *)nullptr, &input_params, &output_params, target_rate,
        cb_passthrough_resampler_duplex, &c, CUBEB_RESAMPLER_QUALITY_VOIP,
        CUBEB_RESAMPLER_RECLOCK_NONE);

    const long BUF_BASE_SIZE = 256;

    // The factor by which the deadline is missed. This is intentionally
    // kind of large to trigger the frame drop quickly. In real life, multiple
    // smaller under-runs would accumulate.
    const long UNDERRUN_FACTOR = 10;
    // Number buffer used for pre-buffering, that some backends do.
    const long PREBUFFER_FACTOR = 2;

    std::vector<float> input_buffer_prebuffer(input_channels * BUF_BASE_SIZE *
                                              PREBUFFER_FACTOR);
    std::vector<float> input_buffer_glitch(input_channels * BUF_BASE_SIZE *
                                           UNDERRUN_FACTOR);
    std::vector<float> input_buffer_normal(input_channels * BUF_BASE_SIZE);
    std::vector<float> output_buffer(output_channels * BUF_BASE_SIZE);

    long seq_idx = 0;
    long output_seq_idx = 0;

    long prebuffer_frames =
        input_buffer_prebuffer.size() / input_params.channels;
    seq_idx = seq(input_buffer_prebuffer.data(), input_channels, seq_idx,
                  prebuffer_frames);

    long got = cubeb_resampler_fill(resampler, input_buffer_prebuffer.data(),
                                    &prebuffer_frames, output_buffer.data(),
                                    BUF_BASE_SIZE);

    output_seq_idx += BUF_BASE_SIZE;

    // prebuffer_frames will hold the frames used by the resampler.
    ASSERT_EQ(prebuffer_frames, BUF_BASE_SIZE);
    ASSERT_EQ(got, BUF_BASE_SIZE);

    for (uint32_t i = 0; i < 300; i++) {
      long int frames = BUF_BASE_SIZE;
      if (i != 0 && (i % 100) == 1) {
        // Once in a while, the output thread misses its deadline.
        // The input thread still produces data, so it ends up accumulating.
        // Simulate this by providing a much bigger input buffer. Check that the
        // sequence is now unaligned, meaning we've dropped data to keep
        // everything in sync.
        seq_idx = seq(input_buffer_glitch.data(), input_channels, seq_idx,
                      BUF_BASE_SIZE * UNDERRUN_FACTOR);
        frames = BUF_BASE_SIZE * UNDERRUN_FACTOR;
        got =
            cubeb_resampler_fill(resampler, input_buffer_glitch.data(), &frames,
                                 output_buffer.data(), BUF_BASE_SIZE);
        is_seq(output_buffer.data(), 2, BUF_BASE_SIZE, output_seq_idx);
        output_seq_idx += BUF_BASE_SIZE;
      } else if (i != 0 && (i % 100) == 2) {
        // On the next iteration, the sequence should be broken
        seq_idx = seq(input_buffer_normal.data(), input_channels, seq_idx,
                      BUF_BASE_SIZE);
        long normal_input_frame_count = 256;
        got = cubeb_resampler_fill(resampler, input_buffer_normal.data(),
                                   &normal_input_frame_count,
                                   output_buffer.data(), BUF_BASE_SIZE);
        is_not_seq(output_buffer.data(), output_channels, BUF_BASE_SIZE,
                   output_seq_idx);
        // Reclock so that we can use is_seq again.
        output_seq_idx = output_buffer[BUF_BASE_SIZE * output_channels - 1] + 1;
      } else {
        // normal case
        seq_idx = seq(input_buffer_normal.data(), input_channels, seq_idx,
                      BUF_BASE_SIZE);
        long normal_input_frame_count = 256;
        got = cubeb_resampler_fill(resampler, input_buffer_normal.data(),
                                   &normal_input_frame_count,
                                   output_buffer.data(), BUF_BASE_SIZE);
        is_seq(output_buffer.data(), output_channels, BUF_BASE_SIZE,
               output_seq_idx);
        output_seq_idx += BUF_BASE_SIZE;
      }
      ASSERT_EQ(got, BUF_BASE_SIZE);
    }

    cubeb_resampler_destroy(resampler);
  }
}